

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_unlock_extension.h
# Opt level: O0

void __thiscall dlib::auto_unlock::~auto_unlock(auto_unlock *this)

{
  read_write_mutex *in_RDI;
  rmutex *unaff_retaddr;
  
  if (*(long *)in_RDI == 0) {
    if (*(long *)(in_RDI + 8) == 0) {
      read_write_mutex::unlock(in_RDI);
    }
    else {
      rmutex::unlock(unaff_retaddr,(unsigned_long)in_RDI);
    }
  }
  else {
    mutex::unlock((mutex *)0x3db606);
  }
  return;
}

Assistant:

~auto_unlock (
        )
        {
            if (m != 0)
                m->unlock();
            else if (r != 0)
                r->unlock();
            else
                rw->unlock();
        }